

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

bool __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *node)

{
  bool bVar1;
  Which WVar2;
  uint uVar3;
  uint64_t scopeId;
  Reader RVar4;
  Reader local_1d0;
  Reader local_1a0;
  Reader local_170;
  Reader local_140;
  Reader local_110;
  undefined4 local_dc;
  Fault local_d8;
  Fault f;
  DebugExpression<bool> _kjCondition;
  Reader local_c0;
  undefined1 local_90 [8];
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:224:5)>
  _kjContext224;
  anon_class_16_2_3fe397bd _kjContextFunc224;
  size_t sStack_28;
  Reader *node_local;
  Validator *this_local;
  
  this->isValid = true;
  RVar4 = capnp::schema::Node::Reader::getDisplayName(node);
  _kjContextFunc224.node = RVar4.super_StringPtr.content.ptr;
  sStack_28 = RVar4.super_StringPtr.content.size_;
  (this->nodeName).super_StringPtr.content.ptr = (char *)_kjContextFunc224.node;
  (this->nodeName).super_StringPtr.content.size_ = sStack_28;
  kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::clear(&this->dependencies);
  _kjContext224.func = (anon_class_16_2_3fe397bd *)this;
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++:224:5)>
  ::ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:224:5)>
                 *)local_90,(anon_class_16_2_3fe397bd *)&_kjContext224.func);
  capnp::schema::Node::Reader::getParameters(&local_c0,node);
  uVar3 = List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::size(&local_c0);
  if (uVar3 != 0) {
    f.exception._2_1_ = capnp::schema::Node::Reader::getIsGeneric(node);
    f.exception._3_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 2));
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                      ((DebugExpression *)((long)&f.exception + 3));
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[55]>
                (&local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0xe3,FAILED,"node.getIsGeneric()",
                 "_kjCondition,\"if parameter list is non-empty, isGeneric must be true\"",
                 (DebugExpression<bool> *)((long)&f.exception + 3),
                 (char (*) [55])"if parameter list is non-empty, isGeneric must be true");
      this->isValid = false;
      this_local._7_1_ = false;
      local_dc = 1;
      kj::_::Debug::Fault::~Fault(&local_d8);
      goto LAB_0017cee4;
    }
  }
  WVar2 = capnp::schema::Node::Reader::which(node);
  switch(WVar2) {
  case FILE:
    capnp::schema::Node::Reader::getFile(node);
    verifyVoid();
    break;
  case STRUCT:
    capnp::schema::Node::Reader::getStruct(&local_110,node);
    scopeId = capnp::schema::Node::Reader::getScopeId(node);
    validate(this,&local_110,scopeId);
    break;
  case ENUM:
    capnp::schema::Node::Reader::getEnum(&local_140,node);
    validate(this,&local_140);
    break;
  case INTERFACE:
    capnp::schema::Node::Reader::getInterface(&local_170,node);
    validate(this,&local_170);
    break;
  case CONST:
    capnp::schema::Node::Reader::getConst(&local_1a0,node);
    validate(this,&local_1a0);
    break;
  case ANNOTATION:
    capnp::schema::Node::Reader::getAnnotation(&local_1d0,node);
    validate(this,&local_1d0);
  }
  this_local._7_1_ = (bool)(this->isValid & 1);
  local_dc = 1;
LAB_0017cee4:
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++:224:5)>
  ::~ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:224:5)>
                  *)local_90);
  return this_local._7_1_;
}

Assistant:

bool validate(const schema::Node::Reader& node) {
    isValid = true;
    nodeName = node.getDisplayName();
    dependencies.clear();

    KJ_CONTEXT("validating schema node", nodeName, (uint)node.which());

    if (node.getParameters().size() > 0) {
      KJ_REQUIRE(node.getIsGeneric(), "if parameter list is non-empty, isGeneric must be true") {
        isValid = false;
        return false;
      }
    }

    switch (node.which()) {
      case schema::Node::FILE:
        verifyVoid(node.getFile());
        break;
      case schema::Node::STRUCT:
        validate(node.getStruct(), node.getScopeId());
        break;
      case schema::Node::ENUM:
        validate(node.getEnum());
        break;
      case schema::Node::INTERFACE:
        validate(node.getInterface());
        break;
      case schema::Node::CONST:
        validate(node.getConst());
        break;
      case schema::Node::ANNOTATION:
        validate(node.getAnnotation());
        break;
    }

    // We accept and pass through node types we don't recognize.
    return isValid;
  }